

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<unsigned_short>(String *__return_storage_ptr__,unsigned_short *params)

{
  unsigned_short *value;
  CappedArray<char,_8UL> local_28;
  unsigned_short *local_18;
  unsigned_short *params_local;
  
  local_18 = params;
  params_local = (unsigned_short *)__return_storage_ptr__;
  value = fwd<unsigned_short>(params);
  local_28 = toCharSequence<unsigned_short>(value);
  _::concat<kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_28,(CappedArray<char,_8UL> *)local_28.content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}